

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> *
createSensorValueData
          (vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
           *__return_storage_ptr__,int64_t now,int dataCount)

{
  ostream *poVar1;
  double dVar2;
  undefined1 local_98 [8];
  SensorValues sensorValues;
  double dStack_48;
  int i;
  double value;
  double delta;
  double deltaDelta;
  int dataCount_local;
  int64_t now_local;
  vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> *values;
  
  std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>::
  vector(__return_storage_ptr__);
  std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>::
  reserve(__return_storage_ptr__,(long)dataCount);
  delta = 1e-06;
  value = 0.0;
  dStack_48 = 0.0;
  for (sensorValues.loadCpu4._4_4_ = 1; sensorValues.loadCpu4._4_4_ <= dataCount;
      sensorValues.loadCpu4._4_4_ = sensorValues.loadCpu4._4_4_ + 1) {
    value = delta + value;
    dStack_48 = value + dStack_48;
    if (((0.01 < value) && (0.0 < delta)) || ((value < -0.01 && (delta < 0.0)))) {
      delta = -delta;
    }
    if (sensorValues.loadCpu4._4_4_ % 100000 == 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"index ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,sensorValues.loadCpu4._4_4_);
      poVar1 = std::operator<<(poVar1,": v=");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,dStack_48);
      poVar1 = std::operator<<(poVar1,", delta=");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,value);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    local_98 = (undefined1  [8])0xffffffffffffffff;
    sensorValues.id = now + -1000 + (long)(sensorValues.loadCpu4._4_4_ * 0x14);
    sensorValues.time = (int64_t)(dStack_48 + 19.5);
    dVar2 = cos(dStack_48);
    sensorValues.temperatureOutside = dStack_48 * dVar2 + 23.3;
    dVar2 = sin(dStack_48);
    sensorValues.temperatureInside = dStack_48 * dVar2 + 42.75;
    sensorValues.temperatureCpu = 0.8 - dStack_48;
    sensorValues.loadCpu1 = 0.7 - dStack_48;
    sensorValues.loadCpu2 = 0.6 - dStack_48;
    sensorValues.loadCpu3 = 0.5 - dStack_48;
    std::vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>::
    emplace_back<objectbox::tsdemo::SensorValues&>
              ((vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>
                *)__return_storage_ptr__,(SensorValues *)local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SensorValues> createSensorValueData(int64_t now, int dataCount) {
    std::vector<SensorValues> values;
    values.reserve(dataCount);
    double deltaDelta = 0.000001;
    double delta = 0.0;
    double value = 0.0;
    for (int i = 1; i <= dataCount; ++i) {
        delta += deltaDelta;
        value += delta;
        if ((delta > 0.01 && deltaDelta > 0) || (delta < -0.01 && deltaDelta < 0)) {
            deltaDelta = -deltaDelta;
        }
        if (i % 100000 == 0) std::cout << "index " << i << ": v=" << value << ", delta=" << delta << std::endl;

        SensorValues sensorValues{OBX_ID_NEW,
                                  now - 1000 + i * 20,
                                  19.5 + value,
                                  23.3 + value * cos(value),
                                  42.75 + value * sin(value),
                                  0.80 - value,
                                  0.7 - value,
                                  0.6 - value,
                                  0.5 - value};
        values.emplace_back(sensorValues);
    }
    return values;
}